

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<8>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  byte bVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  char cVar30;
  byte bVar31;
  bool bVar32;
  AABBNodeMB4D *node1;
  uint uVar33;
  ulong uVar34;
  byte bVar35;
  undefined4 uVar36;
  ulong *puVar37;
  long lVar38;
  ulong uVar39;
  NodeRef root;
  uint uVar40;
  undefined1 (*pauVar41) [32];
  byte bVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar46 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar47 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar48 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 in_ZMM4 [64];
  float fVar80;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar81 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  vfloat4 a0;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar104 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar105 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5be4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b80;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [8];
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  undefined4 uStack_5a84;
  undefined1 local_5a80 [8];
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  undefined4 uStack_5a64;
  undefined1 local_5a60 [32];
  uint local_5a40;
  uint uStack_5a3c;
  uint uStack_5a38;
  uint uStack_5a34;
  uint uStack_5a30;
  uint uStack_5a2c;
  uint uStack_5a28;
  uint uStack_5a24;
  uint local_5a20;
  uint uStack_5a1c;
  uint uStack_5a18;
  uint uStack_5a14;
  uint uStack_5a10;
  uint uStack_5a0c;
  uint uStack_5a08;
  uint uStack_5a04;
  uint local_5a00;
  uint uStack_59fc;
  uint uStack_59f8;
  uint uStack_59f4;
  uint uStack_59f0;
  uint uStack_59ec;
  uint uStack_59e8;
  uint uStack_59e4;
  undefined1 local_59e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  int iVar45;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  
  bvh = (BVH *)This->ptr;
  sVar1 = (bvh->root).ptr;
  if (sVar1 != 8) {
    auVar54 = *(undefined1 (*) [32])(ray + 0x100);
    auVar50 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar43 = vcmpps_avx512vl(auVar54,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar34 = vpcmpeqd_avx512vl(auVar50,(undefined1  [32])valid_i->field_0);
    uVar43 = uVar43 & uVar34;
    bVar42 = (byte)uVar43;
    if (bVar42 != 0) {
      local_5b20 = *(undefined1 (*) [32])(ray + 0x80);
      local_5b00 = *(undefined1 (*) [32])(ray + 0xa0);
      local_5ae0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar108._0_4_ = local_5ae0._0_4_ * local_5ae0._0_4_;
      auVar108._4_4_ = local_5ae0._4_4_ * local_5ae0._4_4_;
      auVar108._8_4_ = local_5ae0._8_4_ * local_5ae0._8_4_;
      auVar108._12_4_ = local_5ae0._12_4_ * local_5ae0._12_4_;
      auVar108._16_4_ = local_5ae0._16_4_ * local_5ae0._16_4_;
      auVar108._20_4_ = local_5ae0._20_4_ * local_5ae0._20_4_;
      auVar108._28_36_ = in_ZMM4._28_36_;
      auVar108._24_4_ = local_5ae0._24_4_ * local_5ae0._24_4_;
      auVar48 = vfmadd231ps_fma(auVar108._0_32_,local_5b00,local_5b00);
      auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),local_5b20,local_5b20);
      auVar49 = vrsqrt14ps_avx512vl(ZEXT1632(auVar48));
      auVar50._8_4_ = 0xbf000000;
      auVar50._0_8_ = 0xbf000000bf000000;
      auVar50._12_4_ = 0xbf000000;
      auVar50._16_4_ = 0xbf000000;
      auVar50._20_4_ = 0xbf000000;
      auVar50._24_4_ = 0xbf000000;
      auVar50._28_4_ = 0xbf000000;
      auVar50 = vmulps_avx512vl(ZEXT1632(auVar48),auVar50);
      fVar80 = auVar49._0_4_;
      fVar84 = auVar49._4_4_;
      fVar85 = auVar49._8_4_;
      fVar86 = auVar49._12_4_;
      fVar87 = auVar49._16_4_;
      fVar88 = auVar49._20_4_;
      fVar89 = auVar49._24_4_;
      auVar48._0_4_ = fVar80 * fVar80;
      auVar48._4_4_ = fVar84 * fVar84;
      auVar48._8_4_ = fVar85 * fVar85;
      auVar48._12_4_ = fVar86 * fVar86;
      auVar52._4_4_ = auVar48._4_4_ * fVar84 * auVar50._4_4_;
      auVar52._0_4_ = auVar48._0_4_ * fVar80 * auVar50._0_4_;
      auVar52._8_4_ = auVar48._8_4_ * fVar85 * auVar50._8_4_;
      auVar52._12_4_ = auVar48._12_4_ * fVar86 * auVar50._12_4_;
      auVar52._16_4_ = fVar87 * fVar87 * fVar87 * auVar50._16_4_;
      auVar52._20_4_ = fVar88 * fVar88 * fVar88 * auVar50._20_4_;
      auVar52._24_4_ = fVar89 * fVar89 * fVar89 * auVar50._24_4_;
      auVar52._28_4_ = auVar50._28_4_;
      auVar51._8_4_ = 0x3fc00000;
      auVar51._0_8_ = 0x3fc000003fc00000;
      auVar51._12_4_ = 0x3fc00000;
      auVar51._16_4_ = 0x3fc00000;
      auVar51._20_4_ = 0x3fc00000;
      auVar51._24_4_ = 0x3fc00000;
      auVar51._28_4_ = 0x3fc00000;
      local_59c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar52,auVar49,auVar51);
      auVar77._8_4_ = 0x80000000;
      auVar77._0_8_ = 0x8000000080000000;
      auVar77._12_4_ = 0x80000000;
      auVar81._12_4_ = 0;
      auVar81._0_12_ = ZEXT812(0);
      auVar81 = auVar81 << 0x20;
      auVar48 = vpcmpeqd_avx(auVar48,auVar48);
      uVar34 = uVar43;
      while (uVar34 != 0) {
        lVar38 = 0;
        for (uVar44 = uVar34; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
          lVar38 = lVar38 + 1;
        }
        uVar34 = uVar34 - 1 & uVar34;
        uVar44 = (ulong)(uint)((int)lVar38 * 4);
        auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar44 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar44 + 0xa0)),0x1c);
        auVar46 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + uVar44 + 0xc0)),0x28);
        fVar80 = *(float *)((long)&local_59c0 + uVar44);
        auVar95._0_4_ = auVar46._0_4_ * fVar80;
        auVar95._4_4_ = auVar46._4_4_ * fVar80;
        auVar95._8_4_ = auVar46._8_4_ * fVar80;
        auVar95._12_4_ = auVar46._12_4_ * fVar80;
        auVar96 = vshufpd_avx(auVar95,auVar95,1);
        auVar46 = vmovshdup_avx(auVar95);
        auVar47 = vunpckhps_avx(auVar95,auVar81);
        auVar97 = vshufps_avx(auVar47,ZEXT416(auVar46._0_4_ ^ 0x80000000),0x41);
        auVar47._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
        auVar47._8_8_ = auVar96._8_8_ ^ auVar77._8_8_;
        auVar46 = vdpps_avx(auVar97,auVar97,0x7f);
        auVar47 = vinsertps_avx(auVar47,auVar95,0x2a);
        auVar96 = vdpps_avx(auVar47,auVar47,0x7f);
        uVar8 = vcmpps_avx512vl(auVar96,auVar46,1);
        auVar46 = vpmovm2d_avx512vl(uVar8);
        auVar101._0_4_ = auVar46._0_4_;
        auVar101._4_4_ = auVar101._0_4_;
        auVar101._8_4_ = auVar101._0_4_;
        auVar101._12_4_ = auVar101._0_4_;
        uVar44 = vpmovd2m_avx512vl(auVar101);
        auVar46._4_4_ = (uint)((byte)(uVar44 >> 1) & 1) * auVar48._4_4_;
        auVar46._0_4_ = (uint)((byte)uVar44 & 1) * auVar48._0_4_;
        auVar46._8_4_ = (uint)((byte)(uVar44 >> 2) & 1) * auVar48._8_4_;
        auVar46._12_4_ = (uint)((byte)(uVar44 >> 3) & 1) * auVar48._12_4_;
        auVar46 = vblendvps_avx(auVar47,auVar97,auVar46);
        auVar96 = vdpps_avx(auVar46,auVar46,0x7f);
        auVar47 = vrsqrt14ss_avx512f(auVar81,ZEXT416((uint)auVar96._0_4_));
        fVar84 = auVar47._0_4_;
        fVar84 = fVar84 * 1.5 - auVar96._0_4_ * 0.5 * fVar84 * fVar84 * fVar84;
        auVar97._0_4_ = auVar46._0_4_ * fVar84;
        auVar97._4_4_ = auVar46._4_4_ * fVar84;
        auVar97._8_4_ = auVar46._8_4_ * fVar84;
        auVar97._12_4_ = auVar46._12_4_ * fVar84;
        auVar46 = vshufps_avx(auVar97,auVar97,0xc9);
        auVar96 = vshufps_avx(auVar95,auVar95,0xc9);
        auVar102._0_4_ = auVar97._0_4_ * auVar96._0_4_;
        auVar102._4_4_ = auVar97._4_4_ * auVar96._4_4_;
        auVar102._8_4_ = auVar97._8_4_ * auVar96._8_4_;
        auVar102._12_4_ = auVar97._12_4_ * auVar96._12_4_;
        auVar46 = vfmsub231ps_fma(auVar102,auVar95,auVar46);
        auVar96 = vshufps_avx(auVar46,auVar46,0xc9);
        auVar46 = vdpps_avx(auVar96,auVar96,0x7f);
        auVar47 = vrsqrt14ss_avx512f(auVar81,ZEXT416((uint)auVar46._0_4_));
        fVar84 = auVar47._0_4_;
        in_ZMM15 = ZEXT464((uint)(fVar84 * 1.5));
        in_ZMM14 = ZEXT464((uint)(fVar84 * fVar84));
        fVar84 = fVar84 * 1.5 - auVar46._0_4_ * 0.5 * fVar84 * fVar84 * fVar84;
        in_ZMM13 = ZEXT1664(CONCAT412(fVar84,CONCAT48(fVar84,CONCAT44(fVar84,fVar84))));
        auVar99._0_4_ = fVar84 * auVar96._0_4_;
        auVar99._4_4_ = fVar84 * auVar96._4_4_;
        auVar99._8_4_ = fVar84 * auVar96._8_4_;
        auVar99._12_4_ = fVar84 * auVar96._12_4_;
        auVar96._0_4_ = fVar80 * auVar95._0_4_;
        auVar96._4_4_ = fVar80 * auVar95._4_4_;
        auVar96._8_4_ = fVar80 * auVar95._8_4_;
        auVar96._12_4_ = fVar80 * auVar95._12_4_;
        auVar47 = vunpcklps_avx(auVar97,auVar96);
        auVar46 = vunpckhps_avx(auVar97,auVar96);
        auVar97 = vunpcklps_avx(auVar99,auVar81);
        auVar96 = vunpckhps_avx(auVar99,auVar81);
        auVar96 = vunpcklps_avx(auVar46,auVar96);
        auVar95 = vunpcklps_avx(auVar47,auVar97);
        auVar46 = vunpckhps_avx(auVar47,auVar97);
        lVar38 = lVar38 * 0x30;
        *(undefined1 (*) [16])(local_59a0 + lVar38) = auVar95;
        *(undefined1 (*) [16])(auStack_5990 + lVar38) = auVar46;
        *(undefined1 (*) [16])(auStack_5980 + lVar38) = auVar96;
      }
      local_5b80._0_8_ = *(undefined8 *)ray;
      local_5b80._8_8_ = *(undefined8 *)(ray + 8);
      local_5b80._16_8_ = *(undefined8 *)(ray + 0x10);
      local_5b80._24_8_ = *(undefined8 *)(ray + 0x18);
      local_5b80._32_8_ = *(undefined8 *)(ray + 0x20);
      local_5b80._40_8_ = *(undefined8 *)(ray + 0x28);
      local_5b80._48_8_ = *(undefined8 *)(ray + 0x30);
      local_5b80._56_8_ = *(undefined8 *)(ray + 0x38);
      local_5b80._64_8_ = *(undefined8 *)(ray + 0x40);
      local_5b80._72_8_ = *(undefined8 *)(ray + 0x48);
      local_5b80._80_8_ = *(undefined8 *)(ray + 0x50);
      local_5b80._88_8_ = *(undefined8 *)(ray + 0x58);
      auVar55._8_4_ = 0x7fffffff;
      auVar55._0_8_ = 0x7fffffff7fffffff;
      auVar55._12_4_ = 0x7fffffff;
      auVar55._16_4_ = 0x7fffffff;
      auVar55._20_4_ = 0x7fffffff;
      auVar55._24_4_ = 0x7fffffff;
      auVar55._28_4_ = 0x7fffffff;
      auVar50 = vandps_avx(local_5b20,auVar55);
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar108 = ZEXT3264(auVar51);
      uVar34 = vcmpps_avx512vl(auVar50,auVar51,1);
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar109 = ZEXT3264(auVar52);
      auVar49 = vdivps_avx512vl(auVar52,local_5b20);
      auVar50 = vandps_avx(local_5b00,auVar55);
      uVar44 = vcmpps_avx512vl(auVar50,auVar51,1);
      auVar53 = vdivps_avx512vl(auVar52,local_5b00);
      auVar50 = vandps_avx(local_5ae0,auVar55);
      uVar39 = vcmpps_avx512vl(auVar50,auVar51,1);
      auVar50 = vdivps_avx512vl(auVar52,local_5ae0);
      bVar32 = (bool)((byte)uVar34 & 1);
      local_5ac0._0_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar49._0_4_;
      bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
      local_5ac0._4_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar49._4_4_;
      bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
      local_5ac0._8_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar49._8_4_;
      bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
      local_5ac0._12_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar49._12_4_;
      bVar32 = (bool)((byte)(uVar34 >> 4) & 1);
      local_5ac0._16_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar49._16_4_;
      bVar32 = (bool)((byte)(uVar34 >> 5) & 1);
      local_5ac0._20_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar49._20_4_;
      bVar32 = (bool)((byte)(uVar34 >> 6) & 1);
      local_5ac0._24_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar49._24_4_;
      bVar32 = SUB81(uVar34 >> 7,0);
      local_5ac0._28_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar49._28_4_;
      bVar32 = (bool)((byte)uVar44 & 1);
      local_5aa0._0_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar53._0_4_;
      bVar32 = (bool)((byte)(uVar44 >> 1) & 1);
      local_5aa0._4_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar53._4_4_;
      bVar32 = (bool)((byte)(uVar44 >> 2) & 1);
      fStack_5a98 = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar53._8_4_);
      bVar32 = (bool)((byte)(uVar44 >> 3) & 1);
      fStack_5a94 = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar53._12_4_);
      bVar32 = (bool)((byte)(uVar44 >> 4) & 1);
      fStack_5a90 = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar53._16_4_);
      bVar32 = (bool)((byte)(uVar44 >> 5) & 1);
      fStack_5a8c = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar53._20_4_);
      bVar32 = (bool)((byte)(uVar44 >> 6) & 1);
      fStack_5a88 = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar53._24_4_);
      bVar32 = SUB81(uVar44 >> 7,0);
      uStack_5a84 = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar53._28_4_;
      bVar32 = (bool)((byte)uVar39 & 1);
      local_5a80._0_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar50._0_4_;
      bVar32 = (bool)((byte)(uVar39 >> 1) & 1);
      local_5a80._4_4_ = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar50._4_4_;
      bVar32 = (bool)((byte)(uVar39 >> 2) & 1);
      fStack_5a78 = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar50._8_4_);
      bVar32 = (bool)((byte)(uVar39 >> 3) & 1);
      fStack_5a74 = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar50._12_4_);
      bVar32 = (bool)((byte)(uVar39 >> 4) & 1);
      fStack_5a70 = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar50._16_4_);
      bVar32 = (bool)((byte)(uVar39 >> 5) & 1);
      fStack_5a6c = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar50._20_4_);
      bVar32 = (bool)((byte)(uVar39 >> 6) & 1);
      fStack_5a68 = (float)((uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar50._24_4_);
      bVar32 = SUB81(uVar39 >> 7,0);
      uStack_5a64 = (uint)bVar32 * 0x5d5e0b6b | (uint)!bVar32 * auVar50._28_4_;
      auVar48 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
      auVar110 = ZEXT1664(auVar48);
      uVar34 = vcmpps_avx512vl(local_5ac0,ZEXT1632(auVar48),1);
      auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_5a60._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar50._4_4_;
      local_5a60._0_4_ = (uint)((byte)uVar34 & 1) * auVar50._0_4_;
      local_5a60._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar50._8_4_;
      local_5a60._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar50._12_4_;
      local_5a60._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * auVar50._16_4_;
      local_5a60._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * auVar50._20_4_;
      local_5a60._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * auVar50._24_4_;
      local_5a60._28_4_ = (uint)(byte)(uVar34 >> 7) * auVar50._28_4_;
      uVar34 = vcmpps_avx512vl(_local_5aa0,ZEXT1632(auVar48),5);
      auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar32 = (bool)((byte)uVar34 & 1);
      local_5a40 = (uint)bVar32 * auVar50._0_4_ | (uint)!bVar32 * 0x60;
      bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
      uStack_5a3c = (uint)bVar32 * auVar50._4_4_ | (uint)!bVar32 * 0x60;
      bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
      uStack_5a38 = (uint)bVar32 * auVar50._8_4_ | (uint)!bVar32 * 0x60;
      bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
      uStack_5a34 = (uint)bVar32 * auVar50._12_4_ | (uint)!bVar32 * 0x60;
      bVar32 = (bool)((byte)(uVar34 >> 4) & 1);
      uStack_5a30 = (uint)bVar32 * auVar50._16_4_ | (uint)!bVar32 * 0x60;
      bVar32 = (bool)((byte)(uVar34 >> 5) & 1);
      uStack_5a2c = (uint)bVar32 * auVar50._20_4_ | (uint)!bVar32 * 0x60;
      bVar32 = (bool)((byte)(uVar34 >> 6) & 1);
      uStack_5a28 = (uint)bVar32 * auVar50._24_4_ | (uint)!bVar32 * 0x60;
      bVar32 = SUB81(uVar34 >> 7,0);
      uStack_5a24 = (uint)bVar32 * auVar50._28_4_ | (uint)!bVar32 * 0x60;
      auVar51 = ZEXT1632(auVar48);
      uVar34 = vcmpps_avx512vl(_local_5a80,auVar51,5);
      auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar32 = (bool)((byte)uVar34 & 1);
      local_5a20 = (uint)bVar32 * auVar50._0_4_ | (uint)!bVar32 * 0xa0;
      bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
      uStack_5a1c = (uint)bVar32 * auVar50._4_4_ | (uint)!bVar32 * 0xa0;
      bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
      uStack_5a18 = (uint)bVar32 * auVar50._8_4_ | (uint)!bVar32 * 0xa0;
      bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
      uStack_5a14 = (uint)bVar32 * auVar50._12_4_ | (uint)!bVar32 * 0xa0;
      bVar32 = (bool)((byte)(uVar34 >> 4) & 1);
      uStack_5a10 = (uint)bVar32 * auVar50._16_4_ | (uint)!bVar32 * 0xa0;
      bVar32 = (bool)((byte)(uVar34 >> 5) & 1);
      uStack_5a0c = (uint)bVar32 * auVar50._20_4_ | (uint)!bVar32 * 0xa0;
      bVar32 = (bool)((byte)(uVar34 >> 6) & 1);
      uStack_5a08 = (uint)bVar32 * auVar50._24_4_ | (uint)!bVar32 * 0xa0;
      bVar32 = SUB81(uVar34 >> 7,0);
      uStack_5a04 = (uint)bVar32 * auVar50._28_4_ | (uint)!bVar32 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar111 = ZEXT3264(local_4680);
      auVar50 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar51);
      local_5a00 = (uint)(bVar42 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar42 & 1) * local_4680._0_4_
      ;
      bVar32 = (bool)((byte)(uVar43 >> 1) & 1);
      uStack_59fc = (uint)bVar32 * auVar50._4_4_ | (uint)!bVar32 * local_4680._4_4_;
      bVar32 = (bool)((byte)(uVar43 >> 2) & 1);
      uStack_59f8 = (uint)bVar32 * auVar50._8_4_ | (uint)!bVar32 * local_4680._8_4_;
      bVar32 = (bool)((byte)(uVar43 >> 3) & 1);
      uStack_59f4 = (uint)bVar32 * auVar50._12_4_ | (uint)!bVar32 * local_4680._12_4_;
      bVar32 = (bool)((byte)(uVar43 >> 4) & 1);
      uStack_59f0 = (uint)bVar32 * auVar50._16_4_ | (uint)!bVar32 * local_4680._16_4_;
      bVar32 = (bool)((byte)(uVar43 >> 5) & 1);
      uStack_59ec = (uint)bVar32 * auVar50._20_4_ | (uint)!bVar32 * local_4680._20_4_;
      bVar32 = (bool)((byte)(uVar43 >> 6) & 1);
      uStack_59e8 = (uint)bVar32 * auVar50._24_4_ | (uint)!bVar32 * local_4680._24_4_;
      bVar32 = SUB81(uVar43 >> 7,0);
      uStack_59e4 = (uint)bVar32 * auVar50._28_4_ | (uint)!bVar32 * local_4680._28_4_;
      auVar54 = vmaxps_avx512vl(auVar54,auVar51);
      local_59e0._0_4_ = (uint)(bVar42 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar42 & 1) * -0x800000;
      bVar32 = (bool)((byte)(uVar43 >> 1) & 1);
      local_59e0._4_4_ = (uint)bVar32 * auVar54._4_4_ | (uint)!bVar32 * -0x800000;
      bVar32 = (bool)((byte)(uVar43 >> 2) & 1);
      local_59e0._8_4_ = (uint)bVar32 * auVar54._8_4_ | (uint)!bVar32 * -0x800000;
      bVar32 = (bool)((byte)(uVar43 >> 3) & 1);
      local_59e0._12_4_ = (uint)bVar32 * auVar54._12_4_ | (uint)!bVar32 * -0x800000;
      bVar32 = (bool)((byte)(uVar43 >> 4) & 1);
      local_59e0._16_4_ = (uint)bVar32 * auVar54._16_4_ | (uint)!bVar32 * -0x800000;
      bVar32 = (bool)((byte)(uVar43 >> 5) & 1);
      local_59e0._20_4_ = (uint)bVar32 * auVar54._20_4_ | (uint)!bVar32 * -0x800000;
      bVar32 = (bool)((byte)(uVar43 >> 6) & 1);
      local_59e0._24_4_ = (uint)bVar32 * auVar54._24_4_ | (uint)!bVar32 * -0x800000;
      bVar32 = SUB81(uVar43 >> 7,0);
      local_59e0._28_4_ = (uint)bVar32 * auVar54._28_4_ | (uint)!bVar32 * -0x800000;
      local_5be4 = (uint)(byte)~bVar42;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar40 = 7;
      }
      else {
        uVar40 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      puVar37 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar41 = (undefined1 (*) [32])local_4640;
      local_5808 = sVar1;
      local_4660 = local_5a00;
      uStack_465c = uStack_59fc;
      uStack_4658 = uStack_59f8;
      uStack_4654 = uStack_59f4;
      uStack_4650 = uStack_59f0;
      uStack_464c = uStack_59ec;
      uStack_4648 = uStack_59e8;
      uStack_4644 = uStack_59e4;
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar112 = ZEXT3264(auVar54);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar113 = ZEXT3264(auVar54);
LAB_01de7ecc:
      do {
        do {
          root.ptr = puVar37[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01de8604;
          puVar37 = puVar37 + -1;
          auVar54 = pauVar41[-1];
          auVar107 = ZEXT3264(auVar54);
          pauVar41 = pauVar41 + -1;
          uVar43 = vcmpps_avx512vl(auVar54,local_59e0,1);
        } while ((char)uVar43 == '\0');
        uVar36 = (undefined4)uVar43;
        if (uVar40 < (uint)POPCOUNT(uVar36)) {
LAB_01de7f13:
          do {
            lVar38 = -0x20;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01de8604;
              uVar8 = vcmpps_avx512vl(auVar107._0_32_,local_59e0,9);
              if ((char)uVar8 != '\0') {
                bVar31 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar2 = This->leafIntersector;
                uVar43 = (ulong)(byte)~(byte)local_5be4;
                bVar35 = 0;
                while (uVar43 != 0) {
                  lVar38 = 0;
                  for (uVar34 = uVar43; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000
                      ) {
                    lVar38 = lVar38 + 1;
                  }
                  uVar43 = uVar43 - 1 & uVar43;
                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                  cVar30 = (**(code **)((long)pvVar2 + (ulong)bVar31 * 0x40 + 0x28))
                                     (&local_59c0,ray,lVar38,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  bVar21 = (byte)(1 << ((uint)lVar38 & 0x1f));
                  if (cVar30 == '\0') {
                    bVar21 = 0;
                  }
                  bVar35 = bVar35 | bVar21;
                }
                bVar35 = (byte)local_5be4 | bVar35;
                local_5be4 = (uint)bVar35;
                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar108 = ZEXT3264(auVar54);
                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar109 = ZEXT3264(auVar54);
                auVar48 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
                auVar110 = ZEXT1664(auVar48);
                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar111 = ZEXT3264(auVar54);
                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar112 = ZEXT3264(auVar54);
                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar113 = ZEXT3264(auVar54);
                if (bVar35 == 0xff) {
                  local_5be4._0_1_ = 0xff;
                  goto LAB_01de8604;
                }
                auVar54 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar32 = (bool)(bVar35 >> 1 & 1);
                bVar3 = (bool)(bVar35 >> 2 & 1);
                bVar4 = (bool)(bVar35 >> 3 & 1);
                bVar5 = (bool)(bVar35 >> 4 & 1);
                bVar6 = (bool)(bVar35 >> 5 & 1);
                bVar7 = (bool)(bVar35 >> 6 & 1);
                local_59e0._4_4_ = (uint)bVar32 * auVar54._4_4_ | (uint)!bVar32 * local_59e0._4_4_;
                local_59e0._0_4_ =
                     (uint)(bVar35 & 1) * auVar54._0_4_ |
                     (uint)!(bool)(bVar35 & 1) * local_59e0._0_4_;
                local_59e0._8_4_ = (uint)bVar3 * auVar54._8_4_ | (uint)!bVar3 * local_59e0._8_4_;
                local_59e0._12_4_ = (uint)bVar4 * auVar54._12_4_ | (uint)!bVar4 * local_59e0._12_4_;
                local_59e0._16_4_ = (uint)bVar5 * auVar54._16_4_ | (uint)!bVar5 * local_59e0._16_4_;
                local_59e0._20_4_ = (uint)bVar6 * auVar54._20_4_ | (uint)!bVar6 * local_59e0._20_4_;
                local_59e0._24_4_ = (uint)bVar7 * auVar54._24_4_ | (uint)!bVar7 * local_59e0._24_4_;
                local_59e0._28_4_ =
                     (uint)(bVar35 >> 7) * auVar54._28_4_ |
                     (uint)!(bool)(bVar35 >> 7) * local_59e0._28_4_;
              }
              goto LAB_01de7ecc;
            }
            uVar43 = root.ptr & 0xfffffffffffffff0;
            uVar33 = (uint)root.ptr & 7;
            root.ptr = 8;
            auVar54 = auVar111._0_32_;
            for (; (lVar38 != 0 && (uVar34 = *(ulong *)(uVar43 + 0x40 + lVar38 * 2), uVar34 != 8));
                lVar38 = lVar38 + 4) {
              auVar104._28_36_ = in_ZMM13._28_36_;
              if ((uVar33 == 6) || (uVar33 == 1)) {
                uVar36 = *(undefined4 *)(uVar43 + 0x120 + lVar38);
                auVar75._4_4_ = uVar36;
                auVar75._0_4_ = uVar36;
                auVar75._8_4_ = uVar36;
                auVar75._12_4_ = uVar36;
                auVar75._16_4_ = uVar36;
                auVar75._20_4_ = uVar36;
                auVar75._24_4_ = uVar36;
                auVar75._28_4_ = uVar36;
                auVar50 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar36 = *(undefined4 *)(uVar43 + 0x60 + lVar38);
                auVar49._4_4_ = uVar36;
                auVar49._0_4_ = uVar36;
                auVar49._8_4_ = uVar36;
                auVar49._12_4_ = uVar36;
                auVar49._16_4_ = uVar36;
                auVar49._20_4_ = uVar36;
                auVar49._24_4_ = uVar36;
                auVar49._28_4_ = uVar36;
                auVar51 = vfmadd213ps_avx512vl(auVar75,auVar50,auVar49);
                uVar36 = *(undefined4 *)(uVar43 + 0x160 + lVar38);
                auVar78._4_4_ = uVar36;
                auVar78._0_4_ = uVar36;
                auVar78._8_4_ = uVar36;
                auVar78._12_4_ = uVar36;
                auVar78._16_4_ = uVar36;
                auVar78._20_4_ = uVar36;
                auVar78._24_4_ = uVar36;
                auVar78._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0xa0 + lVar38);
                auVar53._4_4_ = uVar36;
                auVar53._0_4_ = uVar36;
                auVar53._8_4_ = uVar36;
                auVar53._12_4_ = uVar36;
                auVar53._16_4_ = uVar36;
                auVar53._20_4_ = uVar36;
                auVar53._24_4_ = uVar36;
                auVar53._28_4_ = uVar36;
                auVar52 = vfmadd213ps_avx512vl(auVar78,auVar50,auVar53);
                uVar36 = *(undefined4 *)(uVar43 + 0x1a0 + lVar38);
                auVar82._4_4_ = uVar36;
                auVar82._0_4_ = uVar36;
                auVar82._8_4_ = uVar36;
                auVar82._12_4_ = uVar36;
                auVar82._16_4_ = uVar36;
                auVar82._20_4_ = uVar36;
                auVar82._24_4_ = uVar36;
                auVar82._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0xe0 + lVar38);
                auVar56._4_4_ = uVar36;
                auVar56._0_4_ = uVar36;
                auVar56._8_4_ = uVar36;
                auVar56._12_4_ = uVar36;
                auVar56._16_4_ = uVar36;
                auVar56._20_4_ = uVar36;
                auVar56._24_4_ = uVar36;
                auVar56._28_4_ = uVar36;
                auVar49 = vfmadd213ps_avx512vl(auVar82,auVar50,auVar56);
                uVar36 = *(undefined4 *)(uVar43 + 0x140 + lVar38);
                auVar90._4_4_ = uVar36;
                auVar90._0_4_ = uVar36;
                auVar90._8_4_ = uVar36;
                auVar90._12_4_ = uVar36;
                auVar90._16_4_ = uVar36;
                auVar90._20_4_ = uVar36;
                auVar90._24_4_ = uVar36;
                auVar90._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0x80 + lVar38);
                auVar57._4_4_ = uVar36;
                auVar57._0_4_ = uVar36;
                auVar57._8_4_ = uVar36;
                auVar57._12_4_ = uVar36;
                auVar57._16_4_ = uVar36;
                auVar57._20_4_ = uVar36;
                auVar57._24_4_ = uVar36;
                auVar57._28_4_ = uVar36;
                auVar53 = vfmadd213ps_avx512vl(auVar90,auVar50,auVar57);
                uVar36 = *(undefined4 *)(uVar43 + 0x180 + lVar38);
                auVar92._4_4_ = uVar36;
                auVar92._0_4_ = uVar36;
                auVar92._8_4_ = uVar36;
                auVar92._12_4_ = uVar36;
                auVar92._16_4_ = uVar36;
                auVar92._20_4_ = uVar36;
                auVar92._24_4_ = uVar36;
                auVar92._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0xc0 + lVar38);
                auVar58._4_4_ = uVar36;
                auVar58._0_4_ = uVar36;
                auVar58._8_4_ = uVar36;
                auVar58._12_4_ = uVar36;
                auVar58._16_4_ = uVar36;
                auVar58._20_4_ = uVar36;
                auVar58._24_4_ = uVar36;
                auVar58._28_4_ = uVar36;
                auVar55 = vfmadd213ps_avx512vl(auVar92,auVar50,auVar58);
                uVar36 = *(undefined4 *)(uVar43 + 0x1c0 + lVar38);
                auVar94._4_4_ = uVar36;
                auVar94._0_4_ = uVar36;
                auVar94._8_4_ = uVar36;
                auVar94._12_4_ = uVar36;
                auVar94._16_4_ = uVar36;
                auVar94._20_4_ = uVar36;
                auVar94._24_4_ = uVar36;
                auVar94._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0x100 + lVar38);
                auVar59._4_4_ = uVar36;
                auVar59._0_4_ = uVar36;
                auVar59._8_4_ = uVar36;
                auVar59._12_4_ = uVar36;
                auVar59._16_4_ = uVar36;
                auVar59._20_4_ = uVar36;
                auVar59._24_4_ = uVar36;
                auVar59._28_4_ = uVar36;
                auVar56 = vfmadd213ps_avx512vl(auVar94,auVar50,auVar59);
                auVar22._8_8_ = local_5b80._8_8_;
                auVar22._0_8_ = local_5b80._0_8_;
                auVar22._16_8_ = local_5b80._16_8_;
                auVar22._24_8_ = local_5b80._24_8_;
                auVar24._8_8_ = local_5b80._40_8_;
                auVar24._0_8_ = local_5b80._32_8_;
                auVar24._16_8_ = local_5b80._48_8_;
                auVar24._24_8_ = local_5b80._56_8_;
                auVar26._8_8_ = local_5b80._72_8_;
                auVar26._0_8_ = local_5b80._64_8_;
                auVar26._16_8_ = local_5b80._80_8_;
                auVar26._24_8_ = local_5b80._88_8_;
                auVar51 = vsubps_avx(auVar51,auVar22);
                auVar104._0_4_ = local_5ac0._0_4_ * auVar51._0_4_;
                auVar104._4_4_ = local_5ac0._4_4_ * auVar51._4_4_;
                auVar104._8_4_ = local_5ac0._8_4_ * auVar51._8_4_;
                auVar104._12_4_ = local_5ac0._12_4_ * auVar51._12_4_;
                auVar104._16_4_ = local_5ac0._16_4_ * auVar51._16_4_;
                auVar104._20_4_ = local_5ac0._20_4_ * auVar51._20_4_;
                auVar104._24_4_ = local_5ac0._24_4_ * auVar51._24_4_;
                auVar57 = auVar104._0_32_;
                in_ZMM13 = ZEXT3264(auVar57);
                auVar51 = vsubps_avx(auVar52,auVar24);
                auVar105._0_4_ = auVar51._0_4_ * (float)local_5aa0._0_4_;
                auVar105._4_4_ = auVar51._4_4_ * (float)local_5aa0._4_4_;
                auVar105._8_4_ = auVar51._8_4_ * fStack_5a98;
                auVar105._12_4_ = auVar51._12_4_ * fStack_5a94;
                auVar105._16_4_ = auVar51._16_4_ * fStack_5a90;
                auVar105._20_4_ = auVar51._20_4_ * fStack_5a8c;
                auVar105._28_36_ = in_ZMM14._28_36_;
                auVar105._24_4_ = auVar51._24_4_ * fStack_5a88;
                auVar58 = auVar105._0_32_;
                in_ZMM14 = ZEXT3264(auVar58);
                auVar51 = vsubps_avx(auVar49,auVar26);
                auVar106._0_4_ = auVar51._0_4_ * (float)local_5a80._0_4_;
                auVar106._4_4_ = auVar51._4_4_ * (float)local_5a80._4_4_;
                auVar106._8_4_ = auVar51._8_4_ * fStack_5a78;
                auVar106._12_4_ = auVar51._12_4_ * fStack_5a74;
                auVar106._16_4_ = auVar51._16_4_ * fStack_5a70;
                auVar106._20_4_ = auVar51._20_4_ * fStack_5a6c;
                auVar106._28_36_ = in_ZMM15._28_36_;
                auVar106._24_4_ = auVar51._24_4_ * fStack_5a68;
                auVar59 = auVar106._0_32_;
                in_ZMM15 = ZEXT3264(auVar59);
                auVar51 = vsubps_avx(auVar53,auVar22);
                auVar63._4_4_ = local_5ac0._4_4_ * auVar51._4_4_;
                auVar63._0_4_ = local_5ac0._0_4_ * auVar51._0_4_;
                auVar63._8_4_ = local_5ac0._8_4_ * auVar51._8_4_;
                auVar63._12_4_ = local_5ac0._12_4_ * auVar51._12_4_;
                auVar63._16_4_ = local_5ac0._16_4_ * auVar51._16_4_;
                auVar63._20_4_ = local_5ac0._20_4_ * auVar51._20_4_;
                auVar63._24_4_ = local_5ac0._24_4_ * auVar51._24_4_;
                auVar63._28_4_ = auVar53._28_4_;
                auVar51 = vsubps_avx(auVar55,auVar24);
                auVar64._4_4_ = auVar51._4_4_ * (float)local_5aa0._4_4_;
                auVar64._0_4_ = auVar51._0_4_ * (float)local_5aa0._0_4_;
                auVar64._8_4_ = auVar51._8_4_ * fStack_5a98;
                auVar64._12_4_ = auVar51._12_4_ * fStack_5a94;
                auVar64._16_4_ = auVar51._16_4_ * fStack_5a90;
                auVar64._20_4_ = auVar51._20_4_ * fStack_5a8c;
                auVar64._24_4_ = auVar51._24_4_ * fStack_5a88;
                auVar64._28_4_ = uStack_5a84;
                auVar51 = vsubps_avx(auVar56,auVar26);
                auVar65._4_4_ = auVar51._4_4_ * (float)local_5a80._4_4_;
                auVar65._0_4_ = auVar51._0_4_ * (float)local_5a80._0_4_;
                auVar65._8_4_ = auVar51._8_4_ * fStack_5a78;
                auVar65._12_4_ = auVar51._12_4_ * fStack_5a74;
                auVar65._16_4_ = auVar51._16_4_ * fStack_5a70;
                auVar65._20_4_ = auVar51._20_4_ * fStack_5a6c;
                auVar65._24_4_ = auVar51._24_4_ * fStack_5a68;
                auVar65._28_4_ = uStack_5a64;
                auVar51 = vpminsd_avx2(auVar57,auVar63);
                auVar52 = vpminsd_avx2(auVar58,auVar64);
                auVar51 = vpmaxsd_avx2(auVar51,auVar52);
                auVar52 = vpminsd_avx2(auVar59,auVar65);
                auVar51 = vpmaxsd_avx2(auVar51,auVar52);
                auVar49 = vmulps_avx512vl(auVar51,auVar112._0_32_);
                auVar51 = vpmaxsd_avx2(auVar57,auVar63);
                auVar52 = vpmaxsd_avx2(auVar58,auVar64);
                auVar52 = vpminsd_avx2(auVar51,auVar52);
                auVar51 = vpmaxsd_avx2(auVar59,auVar65);
                auVar51 = vpminsd_avx2(auVar52,auVar51);
                auVar52 = vmulps_avx512vl(auVar51,auVar113._0_32_);
                auVar28._4_4_ = uStack_59fc;
                auVar28._0_4_ = local_5a00;
                auVar28._8_4_ = uStack_59f8;
                auVar28._12_4_ = uStack_59f4;
                auVar28._16_4_ = uStack_59f0;
                auVar28._20_4_ = uStack_59ec;
                auVar28._24_4_ = uStack_59e8;
                auVar28._28_4_ = uStack_59e4;
                auVar51 = vpmaxsd_avx2(auVar49,auVar28);
                auVar52 = vpminsd_avx2(auVar52,local_59e0);
                uVar44 = vcmpps_avx512vl(auVar51,auVar52,2);
                if (uVar33 == 6) {
                  uVar36 = *(undefined4 *)(uVar43 + 0x1e0 + lVar38);
                  auVar10._4_4_ = uVar36;
                  auVar10._0_4_ = uVar36;
                  auVar10._8_4_ = uVar36;
                  auVar10._12_4_ = uVar36;
                  auVar10._16_4_ = uVar36;
                  auVar10._20_4_ = uVar36;
                  auVar10._24_4_ = uVar36;
                  auVar10._28_4_ = uVar36;
                  uVar39 = vcmpps_avx512vl(auVar50,auVar10,0xd);
                  uVar36 = *(undefined4 *)(uVar43 + 0x200 + lVar38);
                  auVar11._4_4_ = uVar36;
                  auVar11._0_4_ = uVar36;
                  auVar11._8_4_ = uVar36;
                  auVar11._12_4_ = uVar36;
                  auVar11._16_4_ = uVar36;
                  auVar11._20_4_ = uVar36;
                  auVar11._24_4_ = uVar36;
                  auVar11._28_4_ = uVar36;
                  uVar9 = vcmpps_avx512vl(auVar50,auVar11,1);
                  uVar44 = uVar44 & uVar39 & uVar9;
                }
              }
              else {
                uVar36 = *(undefined4 *)(uVar43 + 0x60 + lVar38);
                auVar93._4_4_ = uVar36;
                auVar93._0_4_ = uVar36;
                auVar93._8_4_ = uVar36;
                auVar93._12_4_ = uVar36;
                auVar93._16_4_ = uVar36;
                auVar93._20_4_ = uVar36;
                auVar93._24_4_ = uVar36;
                auVar93._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0x80 + lVar38);
                auVar91._4_4_ = uVar36;
                auVar91._0_4_ = uVar36;
                auVar91._8_4_ = uVar36;
                auVar91._12_4_ = uVar36;
                auVar91._16_4_ = uVar36;
                auVar91._20_4_ = uVar36;
                auVar91._24_4_ = uVar36;
                auVar91._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0xa0 + lVar38);
                auVar83._4_4_ = uVar36;
                auVar83._0_4_ = uVar36;
                auVar83._8_4_ = uVar36;
                auVar83._12_4_ = uVar36;
                auVar83._16_4_ = uVar36;
                auVar83._20_4_ = uVar36;
                auVar83._24_4_ = uVar36;
                auVar83._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0xc0 + lVar38);
                auVar103._4_4_ = uVar36;
                auVar103._0_4_ = uVar36;
                auVar103._8_4_ = uVar36;
                auVar103._12_4_ = uVar36;
                auVar103._16_4_ = uVar36;
                auVar103._20_4_ = uVar36;
                auVar103._24_4_ = uVar36;
                auVar103._28_4_ = uVar36;
                in_ZMM13 = ZEXT3264(auVar103);
                uVar36 = *(undefined4 *)(uVar43 + 0xe0 + lVar38);
                auVar100._4_4_ = uVar36;
                auVar100._0_4_ = uVar36;
                auVar100._8_4_ = uVar36;
                auVar100._12_4_ = uVar36;
                auVar100._16_4_ = uVar36;
                auVar100._20_4_ = uVar36;
                auVar100._24_4_ = uVar36;
                auVar100._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0x100 + lVar38);
                auVar98._4_4_ = uVar36;
                auVar98._0_4_ = uVar36;
                auVar98._8_4_ = uVar36;
                auVar98._12_4_ = uVar36;
                auVar98._16_4_ = uVar36;
                auVar98._20_4_ = uVar36;
                auVar98._24_4_ = uVar36;
                auVar98._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0x120 + lVar38);
                auVar79._4_4_ = uVar36;
                auVar79._0_4_ = uVar36;
                auVar79._8_4_ = uVar36;
                auVar79._12_4_ = uVar36;
                auVar79._16_4_ = uVar36;
                auVar79._20_4_ = uVar36;
                auVar79._24_4_ = uVar36;
                auVar79._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0x140 + lVar38);
                auVar76._4_4_ = uVar36;
                auVar76._0_4_ = uVar36;
                auVar76._8_4_ = uVar36;
                auVar76._12_4_ = uVar36;
                auVar76._16_4_ = uVar36;
                auVar76._20_4_ = uVar36;
                auVar76._24_4_ = uVar36;
                auVar76._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar43 + 0x160 + lVar38);
                auVar74._4_4_ = uVar36;
                auVar74._0_4_ = uVar36;
                auVar74._8_4_ = uVar36;
                auVar74._12_4_ = uVar36;
                auVar74._16_4_ = uVar36;
                auVar74._20_4_ = uVar36;
                auVar74._24_4_ = uVar36;
                auVar74._28_4_ = uVar36;
                auVar50 = *(undefined1 (*) [32])(ray + 0xe0);
                auVar64 = auVar109._0_32_;
                auVar51 = vsubps_avx512vl(auVar64,auVar50);
                uVar36 = *(undefined4 *)(uVar43 + 0x1e0 + lVar38);
                auVar12._4_4_ = uVar36;
                auVar12._0_4_ = uVar36;
                auVar12._8_4_ = uVar36;
                auVar12._12_4_ = uVar36;
                auVar12._16_4_ = uVar36;
                auVar12._20_4_ = uVar36;
                auVar12._24_4_ = uVar36;
                auVar12._28_4_ = uVar36;
                auVar52 = vmulps_avx512vl(auVar50,auVar12);
                uVar36 = *(undefined4 *)(uVar43 + 0x200 + lVar38);
                auVar13._4_4_ = uVar36;
                auVar13._0_4_ = uVar36;
                auVar13._8_4_ = uVar36;
                auVar13._12_4_ = uVar36;
                auVar13._16_4_ = uVar36;
                auVar13._20_4_ = uVar36;
                auVar13._24_4_ = uVar36;
                auVar13._28_4_ = uVar36;
                auVar49 = vmulps_avx512vl(auVar50,auVar13);
                uVar36 = *(undefined4 *)(uVar43 + 0x220 + lVar38);
                auVar14._4_4_ = uVar36;
                auVar14._0_4_ = uVar36;
                auVar14._8_4_ = uVar36;
                auVar14._12_4_ = uVar36;
                auVar14._16_4_ = uVar36;
                auVar14._20_4_ = uVar36;
                auVar14._24_4_ = uVar36;
                auVar14._28_4_ = uVar36;
                auVar53 = vmulps_avx512vl(auVar50,auVar14);
                auVar57 = auVar110._0_32_;
                auVar52 = vfmadd231ps_avx512vl(auVar52,auVar51,auVar57);
                auVar49 = vfmadd231ps_avx512vl(auVar49,auVar51,auVar57);
                uVar36 = *(undefined4 *)(uVar43 + 0x240 + lVar38);
                auVar15._4_4_ = uVar36;
                auVar15._0_4_ = uVar36;
                auVar15._8_4_ = uVar36;
                auVar15._12_4_ = uVar36;
                auVar15._16_4_ = uVar36;
                auVar15._20_4_ = uVar36;
                auVar15._24_4_ = uVar36;
                auVar15._28_4_ = uVar36;
                auVar55 = vmulps_avx512vl(auVar50,auVar15);
                uVar36 = *(undefined4 *)(uVar43 + 0x260 + lVar38);
                auVar16._4_4_ = uVar36;
                auVar16._0_4_ = uVar36;
                auVar16._8_4_ = uVar36;
                auVar16._12_4_ = uVar36;
                auVar16._16_4_ = uVar36;
                auVar16._20_4_ = uVar36;
                auVar16._24_4_ = uVar36;
                auVar16._28_4_ = uVar36;
                auVar56 = vmulps_avx512vl(auVar50,auVar16);
                uVar36 = *(undefined4 *)(uVar43 + 0x280 + lVar38);
                auVar17._4_4_ = uVar36;
                auVar17._0_4_ = uVar36;
                auVar17._8_4_ = uVar36;
                auVar17._12_4_ = uVar36;
                auVar17._16_4_ = uVar36;
                auVar17._20_4_ = uVar36;
                auVar17._24_4_ = uVar36;
                auVar17._28_4_ = uVar36;
                auVar50 = vmulps_avx512vl(auVar50,auVar17);
                auVar53 = vfmadd231ps_avx512vl(auVar53,auVar51,auVar57);
                auVar55 = vaddps_avx512vl(auVar51,auVar55);
                auVar56 = vaddps_avx512vl(auVar51,auVar56);
                in_ZMM15 = ZEXT3264(auVar56);
                auVar51 = vaddps_avx512vl(auVar51,auVar50);
                in_ZMM14 = ZEXT3264(auVar51);
                auVar23._8_8_ = local_5b80._8_8_;
                auVar23._0_8_ = local_5b80._0_8_;
                auVar23._16_8_ = local_5b80._16_8_;
                auVar23._24_8_ = local_5b80._24_8_;
                auVar25._8_8_ = local_5b80._40_8_;
                auVar25._0_8_ = local_5b80._32_8_;
                auVar25._16_8_ = local_5b80._48_8_;
                auVar25._24_8_ = local_5b80._56_8_;
                auVar27._8_8_ = local_5b80._72_8_;
                auVar27._0_8_ = local_5b80._64_8_;
                auVar27._16_8_ = local_5b80._80_8_;
                auVar27._24_8_ = local_5b80._88_8_;
                auVar50 = vmulps_avx512vl(auVar79,local_5ae0);
                auVar57 = vmulps_avx512vl(auVar76,local_5ae0);
                auVar58 = vmulps_avx512vl(auVar74,local_5ae0);
                auVar50 = vfmadd231ps_avx512vl(auVar50,local_5b00,auVar103);
                auVar57 = vfmadd231ps_avx512vl(auVar57,local_5b00,auVar100);
                auVar58 = vfmadd231ps_avx512vl(auVar58,auVar98,local_5b00);
                auVar50 = vfmadd231ps_avx512vl(auVar50,local_5b20,auVar93);
                auVar57 = vfmadd231ps_avx512vl(auVar57,local_5b20,auVar91);
                auVar58 = vfmadd231ps_avx512vl(auVar58,auVar83,local_5b20);
                auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                vandps_avx512vl(auVar50,auVar59);
                auVar63 = auVar108._0_32_;
                uVar44 = vcmpps_avx512vl(auVar59,auVar63,1);
                bVar32 = (bool)((byte)uVar44 & 1);
                iVar45 = auVar108._0_4_;
                auVar60._0_4_ = (uint)bVar32 * iVar45 | (uint)!bVar32 * auVar50._0_4_;
                bVar32 = (bool)((byte)(uVar44 >> 1) & 1);
                iVar67 = auVar108._4_4_;
                auVar60._4_4_ = (uint)bVar32 * iVar67 | (uint)!bVar32 * auVar50._4_4_;
                bVar32 = (bool)((byte)(uVar44 >> 2) & 1);
                iVar68 = auVar108._8_4_;
                auVar60._8_4_ = (uint)bVar32 * iVar68 | (uint)!bVar32 * auVar50._8_4_;
                bVar32 = (bool)((byte)(uVar44 >> 3) & 1);
                iVar69 = auVar108._12_4_;
                auVar60._12_4_ = (uint)bVar32 * iVar69 | (uint)!bVar32 * auVar50._12_4_;
                bVar32 = (bool)((byte)(uVar44 >> 4) & 1);
                iVar70 = auVar108._16_4_;
                auVar60._16_4_ = (uint)bVar32 * iVar70 | (uint)!bVar32 * auVar50._16_4_;
                bVar32 = (bool)((byte)(uVar44 >> 5) & 1);
                iVar71 = auVar108._20_4_;
                auVar60._20_4_ = (uint)bVar32 * iVar71 | (uint)!bVar32 * auVar50._20_4_;
                bVar32 = (bool)((byte)(uVar44 >> 6) & 1);
                iVar72 = auVar108._24_4_;
                iVar73 = auVar108._28_4_;
                auVar60._24_4_ = (uint)bVar32 * iVar72 | (uint)!bVar32 * auVar50._24_4_;
                bVar32 = SUB81(uVar44 >> 7,0);
                auVar60._28_4_ = (uint)bVar32 * iVar73 | (uint)!bVar32 * auVar50._28_4_;
                vandps_avx512vl(auVar57,auVar59);
                uVar44 = vcmpps_avx512vl(auVar60,auVar63,1);
                bVar32 = (bool)((byte)uVar44 & 1);
                auVar61._0_4_ = (uint)bVar32 * iVar45 | (uint)!bVar32 * auVar57._0_4_;
                bVar32 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar61._4_4_ = (uint)bVar32 * iVar67 | (uint)!bVar32 * auVar57._4_4_;
                bVar32 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar61._8_4_ = (uint)bVar32 * iVar68 | (uint)!bVar32 * auVar57._8_4_;
                bVar32 = (bool)((byte)(uVar44 >> 3) & 1);
                auVar61._12_4_ = (uint)bVar32 * iVar69 | (uint)!bVar32 * auVar57._12_4_;
                bVar32 = (bool)((byte)(uVar44 >> 4) & 1);
                auVar61._16_4_ = (uint)bVar32 * iVar70 | (uint)!bVar32 * auVar57._16_4_;
                bVar32 = (bool)((byte)(uVar44 >> 5) & 1);
                auVar61._20_4_ = (uint)bVar32 * iVar71 | (uint)!bVar32 * auVar57._20_4_;
                bVar32 = (bool)((byte)(uVar44 >> 6) & 1);
                auVar61._24_4_ = (uint)bVar32 * iVar72 | (uint)!bVar32 * auVar57._24_4_;
                bVar32 = SUB81(uVar44 >> 7,0);
                auVar61._28_4_ = (uint)bVar32 * iVar73 | (uint)!bVar32 * auVar57._28_4_;
                vandps_avx512vl(auVar58,auVar59);
                uVar44 = vcmpps_avx512vl(auVar61,auVar63,1);
                bVar32 = (bool)((byte)uVar44 & 1);
                auVar62._0_4_ = (uint)bVar32 * iVar45 | (uint)!bVar32 * auVar58._0_4_;
                bVar32 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar62._4_4_ = (uint)bVar32 * iVar67 | (uint)!bVar32 * auVar58._4_4_;
                bVar32 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar62._8_4_ = (uint)bVar32 * iVar68 | (uint)!bVar32 * auVar58._8_4_;
                bVar32 = (bool)((byte)(uVar44 >> 3) & 1);
                auVar62._12_4_ = (uint)bVar32 * iVar69 | (uint)!bVar32 * auVar58._12_4_;
                bVar32 = (bool)((byte)(uVar44 >> 4) & 1);
                auVar62._16_4_ = (uint)bVar32 * iVar70 | (uint)!bVar32 * auVar58._16_4_;
                bVar32 = (bool)((byte)(uVar44 >> 5) & 1);
                auVar62._20_4_ = (uint)bVar32 * iVar71 | (uint)!bVar32 * auVar58._20_4_;
                bVar32 = (bool)((byte)(uVar44 >> 6) & 1);
                auVar62._24_4_ = (uint)bVar32 * iVar72 | (uint)!bVar32 * auVar58._24_4_;
                bVar32 = SUB81(uVar44 >> 7,0);
                auVar62._28_4_ = (uint)bVar32 * iVar73 | (uint)!bVar32 * auVar58._28_4_;
                auVar50 = vrcp14ps_avx512vl(auVar60);
                auVar57 = vfnmadd213ps_avx512vl(auVar60,auVar50,auVar64);
                auVar57 = vfmadd132ps_avx512vl(auVar57,auVar50,auVar50);
                auVar50 = vrcp14ps_avx512vl(auVar61);
                auVar58 = vfnmadd213ps_avx512vl(auVar61,auVar50,auVar64);
                auVar58 = vfmadd132ps_avx512vl(auVar58,auVar50,auVar50);
                auVar50 = vrcp14ps_avx512vl(auVar62);
                auVar59 = vfnmadd213ps_avx512vl(auVar62,auVar50,auVar64);
                uVar36 = *(undefined4 *)(uVar43 + 0x180 + lVar38);
                auVar18._4_4_ = uVar36;
                auVar18._0_4_ = uVar36;
                auVar18._8_4_ = uVar36;
                auVar18._12_4_ = uVar36;
                auVar18._16_4_ = uVar36;
                auVar18._20_4_ = uVar36;
                auVar18._24_4_ = uVar36;
                auVar18._28_4_ = uVar36;
                auVar63 = vfmadd213ps_avx512vl(auVar79,auVar27,auVar18);
                uVar36 = *(undefined4 *)(uVar43 + 0x1a0 + lVar38);
                auVar19._4_4_ = uVar36;
                auVar19._0_4_ = uVar36;
                auVar19._8_4_ = uVar36;
                auVar19._12_4_ = uVar36;
                auVar19._16_4_ = uVar36;
                auVar19._20_4_ = uVar36;
                auVar19._24_4_ = uVar36;
                auVar19._28_4_ = uVar36;
                auVar64 = vfmadd213ps_avx512vl(auVar76,auVar27,auVar19);
                uVar36 = *(undefined4 *)(uVar43 + 0x1c0 + lVar38);
                auVar20._4_4_ = uVar36;
                auVar20._0_4_ = uVar36;
                auVar20._8_4_ = uVar36;
                auVar20._12_4_ = uVar36;
                auVar20._16_4_ = uVar36;
                auVar20._20_4_ = uVar36;
                auVar20._24_4_ = uVar36;
                auVar20._28_4_ = uVar36;
                auVar65 = vfmadd213ps_avx512vl(auVar74,auVar27,auVar20);
                auVar59 = vfmadd132ps_avx512vl(auVar59,auVar50,auVar50);
                auVar50 = vfmadd231ps_avx512vl(auVar63,auVar25,auVar103);
                auVar63 = vfmadd231ps_avx512vl(auVar64,auVar25,auVar100);
                auVar64 = vfmadd231ps_avx512vl(auVar65,auVar25,auVar98);
                auVar65 = vfmadd231ps_avx512vl(auVar50,auVar23,auVar93);
                auVar63 = vfmadd231ps_avx512vl(auVar63,auVar23,auVar91);
                auVar64 = vfmadd231ps_avx512vl(auVar64,auVar23,auVar83);
                auVar50 = vsubps_avx(auVar52,auVar65);
                auVar52 = vmulps_avx512vl(auVar57,auVar50);
                auVar50 = vsubps_avx(auVar49,auVar63);
                auVar49 = vmulps_avx512vl(auVar58,auVar50);
                auVar50 = vsubps_avx(auVar53,auVar64);
                auVar53 = vmulps_avx512vl(auVar59,auVar50);
                auVar50 = vsubps_avx512vl(auVar55,auVar65);
                auVar55 = vmulps_avx512vl(auVar57,auVar50);
                auVar50 = vsubps_avx(auVar56,auVar63);
                auVar56 = vmulps_avx512vl(auVar58,auVar50);
                auVar50 = vsubps_avx(auVar51,auVar64);
                auVar57 = vmulps_avx512vl(auVar59,auVar50);
                auVar50 = vpminsd_avx2(auVar52,auVar55);
                auVar51 = vpminsd_avx2(auVar49,auVar56);
                auVar50 = vpmaxsd_avx2(auVar50,auVar51);
                auVar51 = vpminsd_avx2(auVar53,auVar57);
                auVar50 = vpmaxsd_avx2(auVar50,auVar51);
                auVar51 = vpmaxsd_avx2(auVar52,auVar55);
                auVar52 = vpmaxsd_avx2(auVar49,auVar56);
                auVar52 = vpminsd_avx2(auVar51,auVar52);
                auVar51 = vpmaxsd_avx2(auVar53,auVar57);
                auVar51 = vpminsd_avx2(auVar52,auVar51);
                auVar49 = vmulps_avx512vl(auVar50,auVar112._0_32_);
                auVar50 = vmulps_avx512vl(auVar51,auVar113._0_32_);
                auVar29._4_4_ = uStack_59fc;
                auVar29._0_4_ = local_5a00;
                auVar29._8_4_ = uStack_59f8;
                auVar29._12_4_ = uStack_59f4;
                auVar29._16_4_ = uStack_59f0;
                auVar29._20_4_ = uStack_59ec;
                auVar29._24_4_ = uStack_59e8;
                auVar29._28_4_ = uStack_59e4;
                auVar51 = vpmaxsd_avx2(auVar49,auVar29);
                auVar50 = vpminsd_avx2(auVar50,local_59e0);
                uVar44 = vcmpps_avx512vl(auVar51,auVar50,2);
              }
              uVar39 = vcmpps_avx512vl(local_59e0,auVar107._0_32_,6);
              uVar44 = uVar44 & uVar39;
              uVar39 = root.ptr;
              auVar66 = auVar54;
              if ((byte)uVar44 != 0) {
                auVar51 = vblendmps_avx512vl(auVar111._0_32_,auVar49);
                bVar32 = (bool)((byte)uVar44 & 1);
                auVar66._0_4_ = (uint)bVar32 * auVar51._0_4_ | (uint)!bVar32 * auVar50._0_4_;
                bVar32 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar66._4_4_ = (uint)bVar32 * auVar51._4_4_ | (uint)!bVar32 * auVar50._4_4_;
                bVar32 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar66._8_4_ = (uint)bVar32 * auVar51._8_4_ | (uint)!bVar32 * auVar50._8_4_;
                bVar32 = (bool)((byte)(uVar44 >> 3) & 1);
                auVar66._12_4_ = (uint)bVar32 * auVar51._12_4_ | (uint)!bVar32 * auVar50._12_4_;
                bVar32 = (bool)((byte)(uVar44 >> 4) & 1);
                auVar66._16_4_ = (uint)bVar32 * auVar51._16_4_ | (uint)!bVar32 * auVar50._16_4_;
                bVar32 = (bool)((byte)(uVar44 >> 5) & 1);
                auVar66._20_4_ = (uint)bVar32 * auVar51._20_4_ | (uint)!bVar32 * auVar50._20_4_;
                bVar32 = (bool)((byte)(uVar44 >> 6) & 1);
                auVar66._24_4_ = (uint)bVar32 * auVar51._24_4_ | (uint)!bVar32 * auVar50._24_4_;
                bVar32 = SUB81(uVar44 >> 7,0);
                auVar66._28_4_ = (uint)bVar32 * auVar51._28_4_ | (uint)!bVar32 * auVar50._28_4_;
                uVar39 = uVar34;
                if (root.ptr != 8) {
                  *puVar37 = root.ptr;
                  puVar37 = puVar37 + 1;
                  *pauVar41 = auVar54;
                  pauVar41 = pauVar41 + 1;
                }
              }
              auVar54 = auVar66;
              root.ptr = uVar39;
            }
            if (root.ptr == 8) goto LAB_01de83b5;
            uVar8 = vcmpps_avx512vl(auVar54,local_59e0,9);
            auVar107 = ZEXT3264(auVar54);
          } while ((byte)uVar40 < (byte)POPCOUNT((int)uVar8));
          *puVar37 = root.ptr;
          puVar37 = puVar37 + 1;
          *pauVar41 = auVar54;
          pauVar41 = pauVar41 + 1;
LAB_01de83b5:
          iVar45 = 4;
        }
        else {
          while (bVar31 = (byte)local_5be4, uVar43 != 0) {
            sVar1 = 0;
            for (uVar34 = uVar43; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              sVar1 = sVar1 + 1;
            }
            uVar43 = uVar43 - 1 & uVar43;
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar32 = occluded1(This,bvh,root,sVar1,(Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_true> *)&local_5b80.field_0,context);
            bVar35 = (byte)(1 << ((uint)sVar1 & 0x1f));
            if (!bVar32) {
              bVar35 = 0;
            }
            local_5be4 = (uint)(bVar31 | bVar35);
          }
          iVar45 = 3;
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar108 = ZEXT3264(auVar50);
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar109 = ZEXT3264(auVar50);
          auVar48 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
          auVar110 = ZEXT1664(auVar48);
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar111 = ZEXT3264(auVar50);
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar112 = ZEXT3264(auVar50);
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar113 = ZEXT3264(auVar50);
          auVar107 = ZEXT3264(auVar54);
          if (bVar31 != 0xff) {
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar32 = (bool)((byte)(local_5be4 >> 1) & 1);
            bVar3 = (bool)((byte)(local_5be4 >> 2) & 1);
            bVar4 = (bool)((byte)(local_5be4 >> 3) & 1);
            bVar5 = (bool)((byte)(local_5be4 >> 4) & 1);
            bVar6 = (bool)((byte)(local_5be4 >> 5) & 1);
            bVar7 = (bool)((byte)(local_5be4 >> 6) & 1);
            local_59e0._4_4_ = (uint)bVar32 * auVar54._4_4_ | (uint)!bVar32 * local_59e0._4_4_;
            local_59e0._0_4_ =
                 (uint)(bVar31 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar31 & 1) * local_59e0._0_4_;
            local_59e0._8_4_ = (uint)bVar3 * auVar54._8_4_ | (uint)!bVar3 * local_59e0._8_4_;
            local_59e0._12_4_ = (uint)bVar4 * auVar54._12_4_ | (uint)!bVar4 * local_59e0._12_4_;
            local_59e0._16_4_ = (uint)bVar5 * auVar54._16_4_ | (uint)!bVar5 * local_59e0._16_4_;
            local_59e0._20_4_ = (uint)bVar6 * auVar54._20_4_ | (uint)!bVar6 * local_59e0._20_4_;
            local_59e0._24_4_ = (uint)bVar7 * auVar54._24_4_ | (uint)!bVar7 * local_59e0._24_4_;
            local_59e0._28_4_ =
                 (local_5be4 >> 7) * auVar54._28_4_ |
                 (uint)!SUB41(local_5be4 >> 7,0) * local_59e0._28_4_;
            iVar45 = 2;
          }
          if (uVar40 < (uint)POPCOUNT(uVar36)) goto LAB_01de7f13;
        }
        if (iVar45 == 3) {
LAB_01de8604:
          local_5be4._0_1_ = (byte)local_5be4 & bVar42;
          bVar32 = (bool)((byte)local_5be4 >> 1 & 1);
          bVar3 = (bool)((byte)local_5be4 >> 2 & 1);
          bVar4 = (bool)((byte)local_5be4 >> 3 & 1);
          bVar5 = (bool)((byte)local_5be4 >> 4 & 1);
          bVar6 = (bool)((byte)local_5be4 >> 5 & 1);
          bVar7 = (bool)((byte)local_5be4 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)((byte)local_5be4 & 1) * -0x800000 |
               (uint)!(bool)((byte)local_5be4 & 1) * *(int *)(ray + 0x100);
          *(uint *)(ray + 0x104) = (uint)bVar32 * -0x800000 | (uint)!bVar32 * *(int *)(ray + 0x104);
          *(uint *)(ray + 0x108) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x108);
          *(uint *)(ray + 0x10c) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x10c);
          *(uint *)(ray + 0x110) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x110);
          *(uint *)(ray + 0x114) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x114);
          *(uint *)(ray + 0x118) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x118);
          *(uint *)(ray + 0x11c) =
               (uint)((byte)local_5be4 >> 7) * -0x800000 |
               (uint)!(bool)((byte)local_5be4 >> 7) * *(int *)(ray + 0x11c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }